

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmtp_engine.cpp
# Opt level: O1

void __thiscall
zmq::zmtp_engine_t::zmtp_engine_t
          (zmtp_engine_t *this,fd_t fd_,options_t *options_,endpoint_uri_pair_t *endpoint_uri_pair_)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  undefined4 in_register_00000034;
  EVP_PKEY_CTX *ctx;
  
  ctx = (EVP_PKEY_CTX *)CONCAT44(in_register_00000034,fd_);
  stream_engine_base_t::stream_engine_base_t
            (&this->super_stream_engine_base_t,fd_,options_,endpoint_uri_pair_,true);
  (this->super_stream_engine_base_t).super_io_object_t.super_i_poll_events._vptr_i_poll_events =
       (_func_int **)&PTR__zmtp_engine_t_001ecac8;
  (this->super_stream_engine_base_t).super_i_engine._vptr_i_engine =
       (_func_int **)&PTR__zmtp_engine_t_001ecb88;
  this->_greeting_size = 0xc;
  this->_greeting_bytes_read = 0;
  this->_subscription_required = false;
  this->_heartbeat_timeout = 0;
  (this->super_stream_engine_base_t)._next_msg =
       (offset_in_stream_engine_base_t_to_subr)routing_id_msg;
  *(undefined8 *)&(this->super_stream_engine_base_t).field_0x550 = 0;
  (this->super_stream_engine_base_t)._process_msg =
       (offset_in_stream_engine_base_t_to_subr)process_routing_id_msg;
  *(undefined8 *)&(this->super_stream_engine_base_t).field_0x560 = 0;
  iVar2 = msg_t::init(&this->_pong_msg,ctx);
  if (iVar2 != 0) {
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    ctx = (EVP_PKEY_CTX *)0x1abd65;
    fprintf(_stderr,"%s (%s:%d)\n",pcVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zmtp_engine.cpp"
            ,0x52);
    fflush(_stderr);
    zmq_abort(pcVar4);
  }
  iVar2 = msg_t::init(&this->_routing_id_msg,ctx);
  if (iVar2 != 0) {
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zmtp_engine.cpp"
            ,0x55);
    fflush(_stderr);
    zmq_abort(pcVar4);
  }
  iVar2 = (this->super_stream_engine_base_t)._options.heartbeat_interval;
  if (0 < iVar2) {
    iVar1 = (this->super_stream_engine_base_t)._options.heartbeat_timeout;
    if (iVar1 != -1) {
      iVar2 = iVar1;
    }
    this->_heartbeat_timeout = iVar2;
  }
  return;
}

Assistant:

zmq::zmtp_engine_t::zmtp_engine_t (
  fd_t fd_,
  const options_t &options_,
  const endpoint_uri_pair_t &endpoint_uri_pair_) :
    stream_engine_base_t (fd_, options_, endpoint_uri_pair_, true),
    _greeting_size (v2_greeting_size),
    _greeting_bytes_read (0),
    _subscription_required (false),
    _heartbeat_timeout (0)
{
    _next_msg = static_cast<int (stream_engine_base_t::*) (msg_t *)> (
      &zmtp_engine_t::routing_id_msg);
    _process_msg = static_cast<int (stream_engine_base_t::*) (msg_t *)> (
      &zmtp_engine_t::process_routing_id_msg);

    int rc = _pong_msg.init ();
    errno_assert (rc == 0);

    rc = _routing_id_msg.init ();
    errno_assert (rc == 0);

    if (_options.heartbeat_interval > 0) {
        _heartbeat_timeout = _options.heartbeat_timeout;
        if (_heartbeat_timeout == -1)
            _heartbeat_timeout = _options.heartbeat_interval;
    }
}